

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_version.cpp
# Opt level: O0

void duckdb::PragmaVersionFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  PragmaVersionData *pPVar1;
  DataChunk *in_RDX;
  PragmaVersionData *data;
  Value *in_stack_ffffffffffffff28;
  Value *in_stack_ffffffffffffff30;
  idx_t in_stack_ffffffffffffff38;
  undefined1 *col_idx;
  DataChunk *this;
  undefined1 local_b0 [40];
  char *in_stack_ffffffffffffff78;
  Value *in_stack_ffffffffffffff80;
  
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator->
            ((optional_ptr<duckdb::GlobalTableFunctionState,_true> *)in_stack_ffffffffffffff30);
  pPVar1 = GlobalTableFunctionState::Cast<duckdb::PragmaVersionData>
                     ((GlobalTableFunctionState *)in_stack_ffffffffffffff30);
  if ((pPVar1->finished & 1U) == 0) {
    DataChunk::SetCardinality(in_RDX,1);
    this = in_RDX;
    DuckDB::LibraryVersion();
    Value::Value(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    DataChunk::SetValue(this,in_stack_ffffffffffffff38,(idx_t)in_stack_ffffffffffffff30,
                        in_stack_ffffffffffffff28);
    Value::~Value(in_stack_ffffffffffffff30);
    DuckDB::SourceID();
    col_idx = local_b0;
    Value::Value(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    DataChunk::SetValue(this,(idx_t)col_idx,(idx_t)in_RDX,in_stack_ffffffffffffff28);
    Value::~Value((Value *)in_RDX);
    pPVar1->finished = true;
  }
  return;
}

Assistant:

static void PragmaVersionFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<PragmaVersionData>();
	if (data.finished) {
		// finished returning values
		return;
	}
	output.SetCardinality(1);
	output.SetValue(0, 0, DuckDB::LibraryVersion());
	output.SetValue(1, 0, DuckDB::SourceID());
	data.finished = true;
}